

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

Clip Rml::ComputeClip(Property *property)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  
  uVar4 = Property::Get<int>(property);
  cVar3 = (char)uVar4;
  if (property->unit != NUMBER) {
    if (property->unit == KEYWORD) {
      if (cVar3 != '\0') {
        if ((uVar4 & 0xff) == 1) {
          cVar3 = -1;
        }
        else {
          cVar3 = (cVar3 != '\x02') * '\x02' + -2;
        }
      }
    }
    else {
      bVar2 = Assert("Invalid clip type",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                     ,0xa0);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      cVar3 = '\0';
    }
  }
  return (Clip)cVar3;
}

Assistant:

Style::Clip ComputeClip(const Property* property)
{
	const int value = property->Get<int>();
	if (property->unit == Unit::KEYWORD)
		return Style::Clip(static_cast<Style::Clip::Type>(value));
	else if (property->unit == Unit::NUMBER)
		return Style::Clip(Style::Clip::Type::Number, static_cast<int8_t>(value));
	RMLUI_ERRORMSG("Invalid clip type");
	return Style::Clip();
}